

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_pkt_generator.c
# Opt level: O0

void rfc5444_writer_flush(rfc5444_writer *writer,rfc5444_writer_target *target,_Bool force)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t sStack_40;
  _Bool error;
  size_t total;
  size_t len;
  rfc5444_writer_pkthandler *handler;
  rfc5444_writer_postprocessor *processor;
  rfc5444_writer_target *prStack_18;
  _Bool force_local;
  rfc5444_writer_target *target_local;
  rfc5444_writer *writer_local;
  
  processor._7_1_ = force;
  prStack_18 = target;
  target_local = (rfc5444_writer_target *)writer;
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_pkt_generator.c"
                  ,0x77,
                  "void rfc5444_writer_flush(struct rfc5444_writer *, struct rfc5444_writer_target *, _Bool)"
                 );
  }
  if (target->sendPacket ==
      (_func_void_rfc5444_writer_ptr_rfc5444_writer_target_ptr_void_ptr_size_t *)0x0) {
    __assert_fail("target->sendPacket",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_pkt_generator.c"
                  ,0x7a,
                  "void rfc5444_writer_flush(struct rfc5444_writer *, struct rfc5444_writer_target *, _Bool)"
                 );
  }
  if ((target->_is_flushed & 1U) != 0) {
    if (!force) {
      return;
    }
    _rfc5444_writer_begin_packet(writer,target);
  }
  *(undefined4 *)&target_local[2]._target_node.prev = 8;
  for (len = target_local[1].packet_size; *(uint8_t **)len != target_local[1].packet_buffer;
      len = *(size_t *)(len + 8)) {
    if (*(long *)(len + 0x18) != 0) {
      (**(code **)(len + 0x18))(target_local,prStack_18);
    }
  }
  *(undefined4 *)&target_local[2]._target_node.prev = 9;
  if (prStack_18->finishPacketHeader !=
      (_func_void_rfc5444_writer_ptr_rfc5444_writer_target_ptr *)0x0) {
    (*prStack_18->finishPacketHeader)((rfc5444_writer *)target_local,prStack_18);
  }
  _write_pktheader(prStack_18);
  total = 1;
  if ((prStack_18->_has_seqno & 1U) != 0) {
    total = 3;
  }
  if ((prStack_18->_pkt).added + (prStack_18->_pkt).set != 0) {
    total = total + 2;
  }
  if (prStack_18->_bin_msgs_size != 0) {
    memmove((prStack_18->_pkt).buffer + total + (prStack_18->_pkt).added + (prStack_18->_pkt).set,
            (prStack_18->_pkt).buffer +
            (prStack_18->_pkt).header + (prStack_18->_pkt).added + (prStack_18->_pkt).allocated,
            prStack_18->_bin_msgs_size);
  }
  bVar1 = false;
  sStack_40 = total + (prStack_18->_pkt).added + (prStack_18->_pkt).set + prStack_18->_bin_msgs_size
  ;
  handler = (rfc5444_writer_pkthandler *)target_local[1].addPacketHeader;
  do {
    if ((handler->_pkthandle_node).prev == (list_entity *)target_local[1].finishPacketHeader) {
LAB_00184610:
      if ((!bVar1) && (sStack_40 != 0)) {
        (*prStack_18->sendPacket)
                  ((rfc5444_writer *)target_local,prStack_18,(prStack_18->_pkt).buffer,sStack_40);
      }
      (prStack_18->_pkt).set = 0;
      prStack_18->_bin_msgs_size = 0;
      prStack_18->_is_flushed = true;
      *(undefined4 *)&target_local[2]._target_node.prev = 0;
      return;
    }
    uVar3 = (*(code *)handler[2]._pkthandle_node.next)(handler,0xffffffff);
    if (((uVar3 & 1) != 0) &&
       (iVar2 = (*(code *)handler[2]._pkthandle_node.prev)
                          (handler,prStack_18,0,(prStack_18->_pkt).buffer,&stack0xffffffffffffffc0),
       iVar2 != 0)) {
      bVar1 = true;
      goto LAB_00184610;
    }
    handler = (rfc5444_writer_pkthandler *)(handler->_pkthandle_node).next;
  } while( true );
}

Assistant:

void
rfc5444_writer_flush(struct rfc5444_writer *writer, struct rfc5444_writer_target *target, bool force) {
  struct rfc5444_writer_postprocessor *processor;
  struct rfc5444_writer_pkthandler *handler;
  size_t len, total;
  bool error;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  assert(target->sendPacket);

  if (target->_is_flushed) {
    if (!force) {
      return;
    }

    /* begin a new packet, buffer is flushed at the moment */
    _rfc5444_writer_begin_packet(writer, target);
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_FINISH_PKTTLV;
#endif

  /* finalize packet tlvs */
  list_for_each_element_reverse(&writer->_pkthandlers, handler, _pkthandle_node) {
    if (handler->finishPacketTLVs) {
      handler->finishPacketTLVs(writer, target);
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_FINISH_PKTHEADER;
#endif
  /* finalize packet header */
  if (target->finishPacketHeader) {
    target->finishPacketHeader(writer, target);
  }

  /* write packet header (including tlvblock length if necessary */
  _write_pktheader(target);

  /* calculate true length of header (optional tlv block !) */
  len = 1;
  if (target->_has_seqno) {
    len += 2;
  }
  if (target->_pkt.added + target->_pkt.set > 0) {
    len += 2;
  }

  /* compress packet buffer */
  if (target->_bin_msgs_size) {
    memmove(&target->_pkt.buffer[len + target->_pkt.added + target->_pkt.set],
      &target->_pkt.buffer[target->_pkt.header + target->_pkt.added + target->_pkt.allocated], target->_bin_msgs_size);
  }

  /* run post-processors */
  error = false;
  total = len + target->_pkt.added + target->_pkt.set + target->_bin_msgs_size;
  avl_for_each_element(&writer->_processors, processor, _node) {
    if (processor->is_matching_signature(processor, RFC5444_WRITER_PKT_POSTPROCESSOR)) {
      if (processor->process(processor, target, NULL, &target->_pkt.buffer[0], &total)) {
        /* error, stop postprocessing and drop message */
        error = true;
        break;
      }
    }
  }

  if (!error && total > 0) {
    /* send packet */
    target->sendPacket(writer, target, target->_pkt.buffer, total);
  }

  /* cleanup length information */
  target->_pkt.set = 0;
  target->_bin_msgs_size = 0;

  /* mark buffer as flushed */
  target->_is_flushed = true;

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif

#if DEBUG_CLEANUP == true
  memset(target->_pkt.buffer, 252, target->_pkt.max);
#endif
}